

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O0

void __thiscall qclab::qgates::CX<std::complex<double>_>::CX(CX<std::complex<double>_> *this)

{
  CX<std::complex<double>_> *this_local;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,0,1);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00754e88;
  std::make_unique<qclab::qgates::PauliX<std::complex<double>>,int>((int *)&this->gate_);
  return;
}

Assistant:

CX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliX< T > >( 1 ) )
        { }